

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

uint __thiscall
btAxisSweep3Internal<unsigned_int>::addHandle
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          void *pOwner,short collisionFilterGroup,short collisionFilterMask,btDispatcher *dispatcher
          ,void *multiSapProxy)

{
  uint index;
  uint uVar1;
  Handle *pHVar2;
  btAxisSweep3Internal<unsigned_int> *in_RCX;
  btAxisSweep3Internal<unsigned_int> *in_RDI;
  short in_R8W;
  short in_R9W;
  void *in_stack_00000010;
  uint axis;
  uint limit;
  Handle *pHandle;
  uint handle;
  uint max [3];
  uint min [3];
  uint local_50;
  undefined1 updateOverlaps;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  btAxisSweep3Internal<unsigned_int> *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  btAxisSweep3Internal<unsigned_int> *this_00;
  
  this_00 = in_RCX;
  quantize(in_RCX,(uint *)CONCAT26(in_R8W,CONCAT24(in_R9W,in_stack_ffffffffffffffd8)),
           (btVector3 *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  quantize(this_00,(uint *)CONCAT26(in_R8W,CONCAT24(in_R9W,in_stack_ffffffffffffffd8)),
           (btVector3 *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  index = allocHandle(in_RCX);
  pHVar2 = getHandle(in_RDI,index);
  (pHVar2->super_btBroadphaseProxy).m_uniqueId = index;
  (pHVar2->super_btBroadphaseProxy).m_clientObject = this_00;
  (pHVar2->super_btBroadphaseProxy).m_collisionFilterGroup = in_R8W;
  (pHVar2->super_btBroadphaseProxy).m_collisionFilterMask = in_R9W;
  (pHVar2->super_btBroadphaseProxy).m_multiSapParentProxy = in_stack_00000010;
  uVar1 = in_RDI->m_numHandles * 2;
  for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
    in_RDI->m_pHandles->m_maxEdges[local_50] = in_RDI->m_pHandles->m_maxEdges[local_50] + 2;
    in_RDI->m_pEdges[local_50][uVar1 + 1] = in_RDI->m_pEdges[local_50][uVar1 - 1];
    in_RDI->m_pEdges[local_50][uVar1 - 1].m_pos =
         *(uint *)(&stack0xffffffffffffffd0 + (ulong)local_50 * 4);
    in_RDI->m_pEdges[local_50][uVar1 - 1].m_handle = index;
    in_RDI->m_pEdges[local_50][uVar1].m_pos =
         *(uint *)(&stack0xffffffffffffffc4 + (ulong)local_50 * 4);
    in_RDI->m_pEdges[local_50][uVar1].m_handle = index;
    *(uint *)((long)(&(pHVar2->super_btBroadphaseProxy).m_aabbMax + 1) + (ulong)local_50 * 4) =
         uVar1 - 1;
    pHVar2->m_maxEdges[local_50] = uVar1;
  }
  sortMinDown(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
              (btDispatcher *)CONCAT44(in_stack_ffffffffffffffc4,index),
              SUB81((ulong)pHVar2 >> 0x38,0));
  updateOverlaps = (undefined1)((ulong)pHVar2 >> 0x38);
  sortMaxDown(this_00,CONCAT22(in_R8W,in_R9W),in_stack_ffffffffffffffd8,
              (btDispatcher *)in_stack_ffffffffffffffd0,
              SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0));
  sortMinDown(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
              (btDispatcher *)CONCAT44(in_stack_ffffffffffffffc4,index),(bool)updateOverlaps);
  sortMaxDown(this_00,CONCAT22(in_R8W,in_R9W),in_stack_ffffffffffffffd8,
              (btDispatcher *)in_stack_ffffffffffffffd0,
              SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0));
  sortMinDown(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
              (btDispatcher *)CONCAT44(in_stack_ffffffffffffffc4,index),(bool)updateOverlaps);
  sortMaxDown(this_00,CONCAT22(in_R8W,in_R9W),in_stack_ffffffffffffffd8,
              (btDispatcher *)in_stack_ffffffffffffffd0,
              SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0));
  return index;
}

Assistant:

BP_FP_INT_TYPE btAxisSweep3Internal<BP_FP_INT_TYPE>::addHandle(const btVector3& aabbMin,const btVector3& aabbMax, void* pOwner,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
	// quantize the bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// allocate a handle
	BP_FP_INT_TYPE handle = allocHandle();
	

	Handle* pHandle = getHandle(handle);
	
	pHandle->m_uniqueId = static_cast<int>(handle);
	//pHandle->m_pOverlaps = 0;
	pHandle->m_clientObject = pOwner;
	pHandle->m_collisionFilterGroup = collisionFilterGroup;
	pHandle->m_collisionFilterMask = collisionFilterMask;
	pHandle->m_multiSapParentProxy = multiSapProxy;

	// compute current limit of edge arrays
	BP_FP_INT_TYPE limit = static_cast<BP_FP_INT_TYPE>(m_numHandles * 2);

	
	// insert new edges just inside the max boundary edge
	for (BP_FP_INT_TYPE axis = 0; axis < 3; axis++)
	{

		m_pHandles[0].m_maxEdges[axis] += 2;

		m_pEdges[axis][limit + 1] = m_pEdges[axis][limit - 1];

		m_pEdges[axis][limit - 1].m_pos = min[axis];
		m_pEdges[axis][limit - 1].m_handle = handle;

		m_pEdges[axis][limit].m_pos = max[axis];
		m_pEdges[axis][limit].m_handle = handle;

		pHandle->m_minEdges[axis] = static_cast<BP_FP_INT_TYPE>(limit - 1);
		pHandle->m_maxEdges[axis] = limit;
	}

	// now sort the new edges to their correct position
	sortMinDown(0, pHandle->m_minEdges[0], dispatcher,false);
	sortMaxDown(0, pHandle->m_maxEdges[0], dispatcher,false);
	sortMinDown(1, pHandle->m_minEdges[1], dispatcher,false);
	sortMaxDown(1, pHandle->m_maxEdges[1], dispatcher,false);
	sortMinDown(2, pHandle->m_minEdges[2], dispatcher,true);
	sortMaxDown(2, pHandle->m_maxEdges[2], dispatcher,true);


	return handle;
}